

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O0

c_v256 * c_v256_shr_s32(c_v256 a,uint c)

{
  c_v256 *in_RDI;
  c_v128 cVar1;
  c_v128 lo;
  c_v128 in_stack_00000008;
  uint c_00;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  cVar1.u64[1] = in_stack_ffffffffffffffc0;
  cVar1.u64[0] = in_stack_ffffffffffffffb8;
  c_00 = (uint)((ulong)in_RDI >> 0x20);
  cVar1 = c_v128_shr_s32(cVar1,c_00);
  lo = c_v128_shr_s32(in_stack_00000008,c_00);
  c_v256_from_v128(in_RDI,cVar1,lo);
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shr_s32(c_v256 a, unsigned int c) {
  return c_v256_from_v128(c_v128_shr_s32(a.v128[1], c),
                          c_v128_shr_s32(a.v128[0], c));
}